

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::_internal_add_strides
          (SliceDynamicLayerParams *this,int64_t value)

{
  int64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<long>::Add(&this->strides_,&local_8);
  return;
}

Assistant:

inline void SliceDynamicLayerParams::_internal_add_strides(int64_t value) {
  strides_.Add(value);
}